

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O3

void * __thiscall LdConfigDirWrapper::firstSubEntryPtr(LdConfigDirWrapper *this,size_t parentId)

{
  Executable *pEVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  bool isOk;
  char local_29;
  
  local_29 = '\0';
  iVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,parentId,0xffffffffffffffff,&local_29);
  if ((local_29 == '\x01') &&
     (uVar3 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1a])
                        (this,parentId,0xffffffffffffffff), uVar3 != 0)) {
    sVar4 = firstSubEntrySize(this,parentId);
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,CONCAT44(extraout_var,iVar2),(ulong)uVar3,sVar4,0);
    return (void *)CONCAT44(extraout_var_00,iVar2);
  }
  return (void *)0x0;
}

Assistant:

void* LdConfigDirWrapper::firstSubEntryPtr(size_t parentId)
{
    bool isOk = false;
    offset_t offset = this->getNumValue(parentId, &isOk);
    if (!isOk) return NULL;

    Executable::addr_type aT = containsAddrType(parentId);
    if (aT == Executable::NOT_ADDR) return NULL;

    bufsize_t handlerSize = static_cast<bufsize_t>(this->firstSubEntrySize(parentId));
    char *ptr = (char*) m_Exe->getContentAt(offset, aT, handlerSize);
    if (!ptr) return NULL;

    return ptr;
}